

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.cpp
# Opt level: O2

int64_t duckdb::Interval::GetNanoseconds(interval_t *val)

{
  bool bVar1;
  int64_t left;
  ConversionException *this;
  allocator local_41;
  int64_t nano;
  string local_38;
  
  left = GetMicro(val);
  bVar1 = TryMultiplyOperator::Operation<long,long,long>(left,1000,&nano);
  if (bVar1) {
    return nano;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Could not convert Interval to Nanoseconds",&local_41);
  ConversionException::ConversionException(this,&local_38);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

int64_t Interval::GetNanoseconds(const interval_t &val) {
	int64_t nano;
	const auto micro_total = GetMicro(val);
	if (!TryMultiplyOperator::Operation(micro_total, NANOS_PER_MICRO, nano)) {
		throw ConversionException("Could not convert Interval to Nanoseconds");
	}

	return nano;
}